

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwaLookups.cpp
# Opt level: O2

void __thiscall
anon_unknown.dwarf_25a1::LutHeaderWorker::run(LutHeaderWorker *this,bool outputProgress)

{
  ushort uVar1;
  ushort uVar2;
  unsigned_short *puVar3;
  bool bVar4;
  int i;
  size_t sVar5;
  ulong uVar6;
  ulong uVar7;
  int j;
  uint uVar8;
  ulong uVar9;
  ulong unaff_R13;
  size_t sVar10;
  ulong uVar11;
  half candidate [16];
  
  sVar10 = this->_startValue;
  uVar7 = this->_endValue;
  do {
    if (uVar7 <= sVar10) {
      return;
    }
    sVar5 = this->_startValue;
    if (sVar10 % 100 == 0 && outputProgress) {
      fprintf(_stderr," Building acceleration for DwaCompressor, %.2f %%      %c",
              ((double)sVar10 * 100.0) / (double)(uVar7 - sVar5),0xd);
      sVar5 = this->_startValue;
    }
    uVar11 = (ulong)((uint)(ushort)(&(anonymous_namespace)::LutHeaderWorker::
                                     countSetBits(unsigned_short)::numBitsSet)
                                   [(uint)(sVar10 >> 8) & 0xff] +
                    (uint)(ushort)(&(anonymous_namespace)::LutHeaderWorker::
                                    countSetBits(unsigned_short)::numBitsSet)[(uint)sVar10 & 0xff]);
    this->_offset[sVar10 - sVar5] = this->_numElements;
    uVar7 = uVar11;
    for (uVar9 = 0; uVar9 != uVar11; uVar9 = uVar9 + 1) {
      uVar8 = (int)uVar7 - 1;
      uVar7 = (ulong)uVar8;
      bVar4 = false;
      for (uVar6 = 0; uVar6 != 0x10000; uVar6 = uVar6 + 1) {
        if ((uint)(ushort)(&(anonymous_namespace)::LutHeaderWorker::countSetBits(unsigned_short)::
                            numBitsSet)[uVar6 >> 8 & 0xffffff] +
            (uint)(ushort)(&(anonymous_namespace)::LutHeaderWorker::countSetBits(unsigned_short)::
                            numBitsSet)[uVar6 & 0xff] == uVar8) {
          if (bVar4) {
            if (ABS(half::_toFloat[sVar10 & 0xffff].f - half::_toFloat[unaff_R13 & 0xffff].f) <=
                ABS(half::_toFloat[sVar10 & 0xffff].f - half::_toFloat[uVar6].f)) goto LAB_00112f44;
          }
          else {
            bVar4 = true;
          }
          unaff_R13 = uVar6 & 0xffffffff;
        }
LAB_00112f44:
      }
      if (!bVar4) {
        fwrite("bork bork bork!\n",0x10,1,_stderr);
      }
      candidate[uVar9]._h = (unsigned_short)unaff_R13;
    }
    uVar7 = 1;
    for (uVar9 = 0; uVar6 = uVar7, uVar9 != uVar11; uVar9 = uVar9 + 1) {
      for (; uVar6 < uVar11; uVar6 = uVar6 + 1) {
        uVar1 = candidate[uVar9]._h;
        uVar2 = candidate[uVar6]._h;
        if ((uint)(ushort)(&(anonymous_namespace)::LutHeaderWorker::countSetBits(unsigned_short)::
                            numBitsSet)[uVar2 >> 8] +
            (uint)(ushort)(&(anonymous_namespace)::LutHeaderWorker::countSetBits(unsigned_short)::
                            numBitsSet)[uVar2 & 0xff] <
            (uint)(ushort)(&(anonymous_namespace)::LutHeaderWorker::countSetBits(unsigned_short)::
                            numBitsSet)[uVar1 >> 8] +
            (uint)(ushort)(&(anonymous_namespace)::LutHeaderWorker::countSetBits(unsigned_short)::
                            numBitsSet)[uVar1 & 0xff]) {
          candidate[uVar9]._h = uVar2;
          candidate[uVar6]._h = uVar1;
        }
      }
      uVar7 = uVar7 + 1;
    }
    sVar5 = this->_numElements;
    puVar3 = this->_elements;
    for (uVar7 = 0; uVar11 != uVar7; uVar7 = uVar7 + 1) {
      puVar3[sVar5 + uVar7] = candidate[uVar7]._h;
      this->_numElements = sVar5 + 1 + uVar7;
    }
    uVar7 = this->_endValue;
    if (sVar10 == uVar7 - 1) {
      this->_lastCandidateCount = uVar11;
    }
    sVar10 = sVar10 + 1;
  } while( true );
}

Assistant:

void run(bool outputProgress)
            {
                half candidate[16];
                int  candidateCount = 0;

                for (size_t input=_startValue; input<_endValue; ++input) {

                    if (outputProgress) {
#ifdef __GNUC__
                        if (input % 100 == 0) {
                            fprintf(stderr, 
                            " Building acceleration for DwaCompressor, %.2f %%      %c",
                                          100.*(float)input/(float)numValues(), 13);
                        }
#else
                        if (input % 1000 == 0) {
                            fprintf(stderr, 
                            " Building acceleration for DwaCompressor, %.2f %%\n",
                                          100.*(float)input/(float)numValues());
                        }
#endif
                    } 

                    
                    int  numSetBits = countSetBits(input);
                    half inputHalf, closestHalf;

                    inputHalf.setBits(input);

                    _offset[input - _startValue] = _numElements;

                    // Gather candidates
                    candidateCount = 0;
                    for (int targetNumSetBits=numSetBits-1; targetNumSetBits>=0;
                                                           --targetNumSetBits) {
                        bool valueFound = false;

                        for (int i=0; i<65536; ++i) {
                            if (countSetBits(i) != targetNumSetBits) continue;

                            if (!valueFound) {
                                closestHalf.setBits(i);
                                valueFound = true;
                            } else {
                                half tmpHalf;

                                tmpHalf.setBits(i);

                                if (fabs((float)inputHalf - (float)tmpHalf) < 
                                    fabs((float)inputHalf - (float)closestHalf)) {
                                    closestHalf = tmpHalf;
                                }
                            }
                        }

                        if (valueFound == false) {
                            fprintf(stderr, "bork bork bork!\n");
                        }       

                        candidate[candidateCount] = closestHalf;
                        candidateCount++;
                    }

                    // Sort candidates by increasing number of bits set
                    for (int i=0; i<candidateCount; ++i) {
                        for (int j=i+1; j<candidateCount; ++j) {

                            int   iCnt = countSetBits(candidate[i].bits());
                            int   jCnt = countSetBits(candidate[j].bits());

                            if (jCnt < iCnt) {
                                half tmp     = candidate[i];
                                candidate[i] = candidate[j];
                                candidate[j] = tmp;
                            }
                        }
                    }

                    // Copy candidates to the data buffer;
                    for (int i=0; i<candidateCount; ++i) {
                        _elements[_numElements] = candidate[i].bits();
                        _numElements++;
                    }

                    if (input == _endValue-1) {
                        _lastCandidateCount = candidateCount;
                    }
                }
            }